

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

void Node_RemoveNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  nodedata *pnVar2;
  nodedata *pnVar3;
  nodedata *in_RAX;
  nodedata *pnVar4;
  nodedata *pnVar5;
  nodedata *local_28;
  
  if (Node != (node *)0x0) {
    lVar1 = *Node->VMT;
    pnVar5 = (nodedata *)&Node->Data;
    do {
      pnVar5 = pnVar5->Next;
      if (pnVar5 == (nodedata *)0x0) {
        return;
      }
    } while (pnVar5->Code != (Id << 8 | 0xe));
    pnVar2 = pnVar5[2].Next;
    pnVar4 = (nodedata *)&local_28;
    for (pnVar3 = pnVar5[1].Next; local_28 = in_RAX, pnVar3 != (nodedata *)0x0;
        pnVar3 = pnVar3->Next) {
      if (((notifyproc)pnVar3->Code == Func) && (pnVar3[1].Next == (nodedata *)Referer)) {
        local_28 = pnVar3;
        if (pnVar4->Next == pnVar5[1].Next) {
          pnVar5[1].Next = pnVar3->Next;
          pnVar4 = pnVar2;
        }
        else {
          pnVar4->Next = pnVar3->Next;
          pnVar4 = pnVar5[2].Next;
        }
        if (pnVar4 == local_28) {
          pnVar5[2].Next = (nodedata *)0x0;
        }
        else {
          lVar1 = *(long *)(lVar1 + 0x80);
          (**(code **)(lVar1 + 8))(lVar1,local_28,0x18);
        }
        break;
      }
      pnVar4 = pnVar3;
    }
    if ((pnVar5[1].Next == (nodedata *)0x0) && (pnVar2 == pnVar5[2].Next)) {
      Node_RemoveData(Node,Id,0xe);
    }
  }
  return;
}

Assistant:

void Node_RemoveNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;

        n = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (n)
        {
            nodenotify** Ptr;
            nodenotify* Top = n;
            void *OldReferer = Top->Referer;

            n = Top->Next; // skip the first element which is just there to know if an item of the chain is being notified
            Ptr = &n;
            for (;(n=*Ptr)!=NULL;Ptr=&n->Next)
            {
                if (n->Func==Func && n->Referer==Referer)
                {
                    // remove the item from the list
                    if (*Ptr == Top->Next)
                        Top->Next = n->Next;
                    else
                        *Ptr = n->Next;

                    if (Top->Referer==n) // this notification item is being called
                        Top->Referer = NULL; // tell the notifier that it should remove this element after the call
                    else
                        MemHeap_Free(p->NodeHeap,n,sizeof(nodenotify));
                    break;
                }
            }

            if (Top->Next==NULL && OldReferer==Top->Referer)
                Node_RemoveData(Node,Id,TYPE_NODENOTIFY); // the notification list is empty and it's not being called
        }
    }
}